

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intmul_k64(jit_State *J)

{
  long in_RDI;
  jit_State *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (*(ulong *)(in_RDI + 0xc0) < 0x80000000) {
    local_4 = simplify_intmul_k(in_stack_ffffffffffffffe8,0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LJFOLD(MUL any KINT64)
LJFOLDF(simplify_intmul_k64)
{
#if LJ_HASFFI
  if (ir_kint64(fright)->u64 < 0x80000000u)
    return simplify_intmul_k(J, (int32_t)ir_kint64(fright)->u64);
  return NEXTFOLD;
#else
  UNUSED(J); lj_assertJ(0, "FFI IR op without FFI"); return FAILFOLD;
#endif
}